

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O1

SQRESULT sq_arraypop(HSQUIRRELVM v,SQInteger idx,SQBool pushval)

{
  SQOuter *pSVar1;
  long lVar2;
  bool bVar3;
  SQObjectPtr *in_RAX;
  SQRESULT SVar4;
  SQObjectPtr *arr;
  SQObjectPtr *local_28;
  
  if (v->_stackbase < v->_top) {
    local_28 = in_RAX;
    bVar3 = sq_aux_gettypedarg(v,idx,OT_ARRAY,&local_28);
    SVar4 = -1;
    if (bVar3) {
      pSVar1 = (local_28->super_SQObject)._unVal.pOuter;
      lVar2 = pSVar1->_idx;
      if (lVar2 < 1) {
        sq_throwerror(v,"empty array");
      }
      else {
        if (pushval != 0) {
          SQVM::Push(v,pSVar1->_valptr + lVar2 + -1);
        }
        SQArray::Pop((local_28->super_SQObject)._unVal.pArray);
        SVar4 = 0;
      }
    }
  }
  else {
    SQVM::Raise_Error(v,"not enough params in the stack");
    SVar4 = -1;
  }
  return SVar4;
}

Assistant:

SQRESULT sq_arraypop(HSQUIRRELVM v,SQInteger idx,SQBool pushval)
{
    sq_aux_paramscheck(v, 1);
    SQObjectPtr *arr;
    _GETSAFE_OBJ(v, idx, OT_ARRAY,arr);
    if(_array(*arr)->Size() > 0) {
        if(pushval != 0){ v->Push(_array(*arr)->Top()); }
        _array(*arr)->Pop();
        return SQ_OK;
    }
    return sq_throwerror(v, _SC("empty array"));
}